

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProfileInstrument.cpp
# Opt level: O2

void __thiscall Js::Profiler::Push(Profiler *this,TimeEntry entry)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  TreeNode<Js::UnitData,_373> *pTVar4;
  ulong uVar5;
  TimeEntry item;
  
  item.time = entry.time;
  item._0_4_ = entry._0_4_;
  if (this->curNode == (TypeNode *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Core/ProfileInstrument.cpp"
                                ,0xa3,"(0 != curNode)","Profiler Stack Corruption");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  item._4_4_ = 0;
  FixedStack<Js::TimeEntry,_20>::Push(&this->timeStack,item);
  pTVar4 = this->curNode->children[item._0_4_ & 0xffff];
  if (pTVar4 == (TreeNode<Js::UnitData,_373> *)0x0) {
    pTVar4 = (TreeNode<Js::UnitData,_373> *)Memory::ArenaAllocator::NoThrowAlloc(this->alloc,0xbd0);
    TreeNode<Js::UnitData,_373>::TreeNode(pTVar4,this->curNode);
    uVar5 = (ulong)((item._0_4_ & 0xffff) << 3);
    *(TreeNode<Js::UnitData,_373> **)((long)this->curNode->children + uVar5) = pTVar4;
    pTVar4 = *(TreeNode<Js::UnitData,_373> **)((long)this->curNode->children + uVar5);
  }
  this->curNode = pTVar4;
  return;
}

Assistant:

void
    Profiler::Push(TimeEntry entry)
    {
        AssertMsg(NULL != curNode, "Profiler Stack Corruption");

        this->timeStack.Push(entry);
        if(!curNode->ChildExistsAt(entry.tag))
        {
            TypeNode * node = AnewNoThrow(this->alloc, TypeNode, curNode);
            // We crash if we run out of memory here and we don't care
            curNode->SetChildAt(entry.tag, node);
        }
        curNode = curNode->GetChildAt(entry.tag);
    }